

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
::destroy(btree_node<phmap::priv::set_params<phmap::priv::(anonymous_namespace)::StringLike,_phmap::Less<phmap::priv::(anonymous_namespace)::StringLike>,_std::allocator<phmap::priv::(anonymous_namespace)::StringLike>,_256,_false>_>
          *this,allocator_type *alloc)

{
  byte bVar1;
  allocator_type *alloc_00;
  int i;
  ulong i_00;
  
  i_00 = 0;
  while( true ) {
    bVar1 = count(this);
    if (bVar1 <= i_00) break;
    value_destroy(this,i_00,alloc_00);
    i_00 = i_00 + 1;
  }
  return;
}

Assistant:

void destroy(allocator_type *alloc) {
            for (int i = 0; i < count(); ++i) {
                value_destroy(i, alloc);
            }
        }